

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

size_t PHF::uniq<unsigned_int>(uint *k,size_t n)

{
  size_t sVar1;
  long lVar2;
  
  qsort(k,n,4,Uniq::cmp<unsigned_int>);
  sVar1 = 1;
  if (1 < n) {
    sVar1 = 1;
    lVar2 = 0;
    do {
      if (k[sVar1] != k[lVar2]) {
        k[lVar2 + 1] = k[sVar1];
        lVar2 = lVar2 + 1;
      }
      sVar1 = sVar1 + 1;
    } while (n != sVar1);
    sVar1 = lVar2 + 1;
  }
  if (n == 0) {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

PHF_PUBLIC size_t PHF::uniq(key_t k[], const size_t n) {
	using namespace PHF::Uniq;
	size_t i, j;

	qsort(k, n, sizeof *k, reinterpret_cast<int(*)(const void *, const void *)>(&cmp<key_t>));

	for (i = 1, j = 0; i < n; i++) {
		if (k[i] != k[j])
			k[++j] = k[i];
	}

	return (n > 0)? j + 1 : 0;
}